

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_byte_array_stop_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  cram_block *pcVar2;
  uchar *puVar3;
  long lVar4;
  uchar *puVar5;
  uchar uVar6;
  int iVar7;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    iVar7 = slice->hdr->num_blocks;
    iVar1 = -1;
    if (0 < (long)iVar7) {
      lVar4 = 0;
      do {
        pcVar2 = slice->block[lVar4];
        if (((pcVar2 != (cram_block *)0x0) && (pcVar2->content_type == EXTERNAL)) &&
           (pcVar2->content_id == (c->field_6).external.type)) {
          if (iVar7 == (int)lVar4) {
            return -1;
          }
          goto LAB_00143b4b;
        }
        lVar4 = lVar4 + 1;
      } while (iVar7 != lVar4);
    }
  }
  else {
    pcVar2 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar2 == (cram_block *)0x0) {
      iVar1 = -(uint)(*out_size != 0);
    }
    else {
LAB_00143b4b:
      iVar7 = pcVar2->idx;
      iVar1 = -1;
      if (iVar7 < pcVar2->uncomp_size) {
        puVar5 = pcVar2->data;
        puVar3 = puVar5 + iVar7;
        uVar6 = puVar5[iVar7];
        if (uVar6 != (c->field_6).byte_array_stop.stop) {
          puVar5 = puVar5 + iVar7;
          do {
            if ((long)pcVar2->uncomp_size <= (long)puVar5 - (long)pcVar2->data) {
              return -1;
            }
            *out = uVar6;
            out = (char *)((uchar *)out + 1);
            uVar6 = puVar3[1];
            puVar3 = puVar3 + 1;
            puVar5 = puVar5 + 1;
          } while (uVar6 != (c->field_6).byte_array_stop.stop);
          puVar5 = pcVar2->data;
          iVar7 = pcVar2->idx;
        }
        *out_size = (int)puVar3 - (iVar7 + (int)puVar5);
        pcVar2->idx = ((int)puVar3 - (int)puVar5) + 1;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int cram_byte_array_stop_decode_char(cram_slice *slice, cram_codec *c,
					    cram_block *in, char *out,
					    int *out_size) {
    int i;
    cram_block *b = NULL;
    char *cp, ch;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;

    cp = (char *)b->data + b->idx;
    while ((ch = *cp) != (char)c->byte_array_stop.stop) {
	if (cp - (char *)b->data >= b->uncomp_size)
	    return -1;
	*out++ = ch;
	cp++;
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}